

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceId.h
# Opt level: O0

void __thiscall plugin::InterfaceId::InterfaceId(InterfaceId *this,string *name)

{
  ulong uVar1;
  runtime_error *this_00;
  string *name_local;
  InterfaceId *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)name);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Invalid IntefaceId, interface name cannot be empty.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

explicit InterfaceId(const std::string& name)
            : m_name(name)
        {
            if(name.empty())
            {
                throw std::runtime_error("Invalid IntefaceId, interface name cannot be empty.");
            }
        }